

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::IsEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  Type pSVar1;
  Type pBVar2;
  BasicBlock *pBVar3;
  Instr *pIVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  BOOLEAN BVar8;
  OpCode OVar9;
  undefined4 *puVar10;
  Type *ppBVar11;
  BranchInstr *this_01;
  StackSym *pSVar12;
  long lVar13;
  Instr *this_02;
  Func **ppFVar14;
  Opnd *pOVar15;
  Instr *pIVar16;
  undefined1 local_58 [8];
  anon_class_16_2_3f78c113 IsInductionVariableUse;
  Iterator __iter;
  Loop *loop_local;
  
  __iter.current = (NodeBase *)loop;
  bVar6 = GlobOpt::HasMemOp(this->globOpt,loop);
  if (bVar6) {
    local_58 = (undefined1  [8])&__iter.current;
    pSVar1 = (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    IsInductionVariableUse.loop = (Loop **)this;
    if (((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar1 == &loop->blockList) ||
       ((SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)pSVar1->next->next !=
        &loop->blockList)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x239e,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
      if (!bVar6) {
LAB_003d6004:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
      loop = (Loop *)__iter.current;
    }
    else {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    IsInductionVariableUse.this = (BackwardPass *)&loop->blockList;
    __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  IsInductionVariableUse.this;
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_003d6004;
        *puVar10 = 0;
      }
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      bVar6 = (BackwardPass *)__iter.list == IsInductionVariableUse.this;
      if (bVar6) break;
      ppBVar11 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&IsInductionVariableUse.this);
      pBVar2 = *ppBVar11;
      if ((pBVar2->field_0x18 & 1) == 0) {
        pBVar3 = pBVar2->next;
        ppFVar14 = (Func **)&pBVar3->firstInstr;
        if (pBVar3 == (BasicBlock *)0x0) {
          ppFVar14 = &pBVar2->func;
        }
        lVar13 = 0x18;
        if (pBVar3 == (BasicBlock *)0x0) {
          lVar13 = 0xd0;
        }
        lVar13 = *(long *)((long)&(*ppFVar14)->m_alloc + lVar13);
        if (lVar13 == 0) {
          pIVar16 = (Instr *)0x0;
        }
        else {
          pIVar16 = *(Instr **)(lVar13 + 0x10);
        }
        pIVar4 = pBVar2->firstInstr;
LAB_003d5e83:
        this_02 = pIVar4;
        if (this_02 != pIVar16) {
          pIVar4 = this_02->m_next;
          if ((((this_02->m_kind != InstrKindLabel) && (this_02->m_kind != InstrKindProfiledLabel))
              && (bVar7 = IR::Instr::IsRealInstr(this_02), bVar7)) &&
             (OVar9 = this_02->m_opcode, (OVar9 & ~ExtendedOpcodePrefix) != IncrLoopBodyCount)) {
            if (this_02->m_kind == InstrKindBranch) {
              this_01 = IR::Instr::AsBranchInstr(this_02);
              bVar7 = IR::BranchInstr::IsUnconditional(this_01);
              if (bVar7) goto LAB_003d5e83;
              OVar9 = this_02->m_opcode;
            }
            if ((0x24 < OVar9 - 0x1c0) ||
               ((0x1000000003U >> ((ulong)(OVar9 - 0x1c0) & 0x3f) & 1) == 0)) {
              if (OVar9 - 0x26 < 2) {
                pOVar15 = this_02->m_src1;
              }
              else {
                if (OVar9 == Nop) goto LAB_003d5e83;
                if (this_02->m_kind != InstrKindBranch) {
                  return bVar6;
                }
                bVar7 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                  ((anon_class_16_2_3f78c113 *)local_58,this_02->m_src1);
                if (bVar7) goto LAB_003d5e83;
                pOVar15 = this_02->m_src2;
              }
              bVar7 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                ((anon_class_16_2_3f78c113 *)local_58,pOVar15);
              if (!bVar7) {
                return bVar6;
              }
              goto LAB_003d5e83;
            }
            bVar7 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                              ((anon_class_16_2_3f78c113 *)local_58,this_02->m_dst);
            if (!bVar7) {
              pOVar15 = this_02->m_dst;
              if (pOVar15 == (Opnd *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x23b6,"(instr->GetDst())","instr->GetDst()");
                if (!bVar7) goto LAB_003d6004;
                *puVar10 = 0;
                pOVar15 = this_02->m_dst;
              }
              pSVar12 = IR::Opnd::GetStackSym(pOVar15);
              if (pSVar12 != (StackSym *)0x0) {
                this_00 = (BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x30].next[1].next;
                pSVar12 = IR::Opnd::GetStackSym(this_02->m_dst);
                BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,(pSVar12->super_Sym).m_id)
                ;
                if (BVar8 != '\0') {
                  return bVar6;
                }
              }
            }
          }
          goto LAB_003d5e83;
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool
BackwardPass::IsEmptyLoopAfterMemOp(Loop *loop)
{
    if (globOpt->HasMemOp(loop))
    {
        const auto IsInductionVariableUse = [&](IR::Opnd *opnd) -> bool
        {
            Loop::InductionVariableChangeInfo  inductionVariableChangeInfo = { 0, 0 };
            return (opnd &&
                opnd->GetStackSym() &&
                loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(this->globOpt->GetVarSymID(opnd->GetStackSym())) &&
                (((Loop::InductionVariableChangeInfo)
                    loop->memOpInfo->inductionVariableChangeInfoMap->
                    LookupWithKey(this->globOpt->GetVarSymID(opnd->GetStackSym()), inductionVariableChangeInfo)).unroll != Js::Constants::InvalidLoopUnrollFactor));
        };

        Assert(loop->blockList.HasTwo());

        FOREACH_BLOCK_IN_LOOP(bblock, loop)
        {

            FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrPrev, bblock)
            {
                if (instr->IsLabelInstr() || !instr->IsRealInstr() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || instr->m_opcode == Js::OpCode::StLoopBodyCount
                    || (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional()))
                {
                    continue;
                }
                else
                {
                    switch (instr->m_opcode)
                    {
                    case Js::OpCode::Nop:
                        break;
                    case Js::OpCode::Ld_I4:
                    case Js::OpCode::Add_I4:
                    case Js::OpCode::Sub_I4:

                        if (!IsInductionVariableUse(instr->GetDst()))
                        {
                            Assert(instr->GetDst());
                            if (instr->GetDst()->GetStackSym()
                                && loop->memOpInfo->inductionVariablesUsedAfterLoop->Test(instr->GetDst()->GetStackSym()->m_id))
                            {
                                // We have use after the loop for a variable defined inside the loop. So the loop can't be removed.
                                return false;
                            }
                        }
                        break;
                    case Js::OpCode::Decr_A:
                    case Js::OpCode::Incr_A:
                        if (!IsInductionVariableUse(instr->GetSrc1()))
                        {
                            return false;
                        }
                        break;
                    default:
                        if (instr->IsBranchInstr())
                        {
                            if (IsInductionVariableUse(instr->GetSrc1()) || IsInductionVariableUse(instr->GetSrc2()))
                            {
                                break;
                            }
                        }
                        return false;
                    }
                }

            }
            NEXT_INSTR_IN_BLOCK_EDITING;

        }NEXT_BLOCK_IN_LIST;

        return true;
    }

    return false;
}